

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O1

bool ImGui_ImplSDL2_ProcessEvent(SDL_Event *event)

{
  char cVar1;
  Uint32 UVar2;
  bool bVar3;
  ImGuiIO *this;
  ulong uVar4;
  
  this = ImGui::GetIO();
  UVar2 = event->type;
  bVar3 = false;
  if ((int)UVar2 < 0x401) {
    if (UVar2 - 0x300 < 2) {
      uVar4 = (ulong)(event->key).keysym.scancode;
      if (0x1ff < uVar4) {
        __assert_fail("key >= 0 && key < ((int)(sizeof(io.KeysDown) / sizeof(*(io.KeysDown))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/backends/imgui_impl_sdl.cpp"
                      ,0x73,"bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event *)");
      }
      this->KeysDown[uVar4] = UVar2 == 0x300;
      uVar4 = SDL_GetModState();
      this->KeyShift = (uVar4 & 3) != 0;
      uVar4 = SDL_GetModState();
      this->KeyCtrl = (uVar4 & 0xc0) != 0;
      uVar4 = SDL_GetModState();
      this->KeyAlt = (uVar4 & 0x300) != 0;
      uVar4 = SDL_GetModState();
      this->KeySuper = (uVar4 & 0xc00) != 0;
    }
    else {
      if (UVar2 != 0x303) {
        return false;
      }
      ImGuiIO::AddInputCharactersUTF8(this,(event->edit).text);
    }
    bVar3 = true;
  }
  else if (UVar2 == 0x401) {
    cVar1 = (event->edit).text[4];
    bVar3 = true;
    if (cVar1 == '\x03') {
      _ZL14g_MousePressed_1 = 1;
    }
    else if (cVar1 == '\x02') {
      _ZL14g_MousePressed_2 = 1;
    }
    else if (cVar1 == '\x01') {
      _ZL14g_MousePressed_0 = 1;
    }
  }
  else if (UVar2 == 0x403) {
    if (0 < (event->display).data1) {
      this->MouseWheelH = this->MouseWheelH + 1.0;
    }
    if ((event->display).data1 < 0) {
      this->MouseWheelH = this->MouseWheelH + -1.0;
    }
    if (0 < (event->window).data2) {
      this->MouseWheel = this->MouseWheel + 1.0;
    }
    bVar3 = true;
    if ((event->window).data2 < 0) {
      this->MouseWheel = this->MouseWheel + -1.0;
    }
  }
  return bVar3;
}

Assistant:

bool ImGui_ImplSDL2_ProcessEvent(const SDL_Event* event)
{
    ImGuiIO& io = ImGui::GetIO();
    switch (event->type)
    {
    case SDL_MOUSEWHEEL:
        {
            if (event->wheel.x > 0) io.MouseWheelH += 1;
            if (event->wheel.x < 0) io.MouseWheelH -= 1;
            if (event->wheel.y > 0) io.MouseWheel += 1;
            if (event->wheel.y < 0) io.MouseWheel -= 1;
            return true;
        }
    case SDL_MOUSEBUTTONDOWN:
        {
            if (event->button.button == SDL_BUTTON_LEFT) g_MousePressed[0] = true;
            if (event->button.button == SDL_BUTTON_RIGHT) g_MousePressed[1] = true;
            if (event->button.button == SDL_BUTTON_MIDDLE) g_MousePressed[2] = true;
            return true;
        }
    case SDL_TEXTINPUT:
        {
            io.AddInputCharactersUTF8(event->text.text);
            return true;
        }
    case SDL_KEYDOWN:
    case SDL_KEYUP:
        {
            int key = event->key.keysym.scancode;
            IM_ASSERT(key >= 0 && key < IM_ARRAYSIZE(io.KeysDown));
            io.KeysDown[key] = (event->type == SDL_KEYDOWN);
            io.KeyShift = ((SDL_GetModState() & KMOD_SHIFT) != 0);
            io.KeyCtrl = ((SDL_GetModState() & KMOD_CTRL) != 0);
            io.KeyAlt = ((SDL_GetModState() & KMOD_ALT) != 0);
#ifdef _WIN32
            io.KeySuper = false;
#else
            io.KeySuper = ((SDL_GetModState() & KMOD_GUI) != 0);
#endif
            return true;
        }
    }
    return false;
}